

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O1

int jpc_cox_putcompparms
              (jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out,int prtflag,
              jpc_coxcp_t *compparms)

{
  byte val;
  int iVar1;
  long lVar2;
  
  val = *(byte *)((long)&out->openmode_ + 1);
  if (0x20 < val) {
    __assert_fail("compparms->numdlvls <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_cs.c"
                  ,0x343,
                  "int jpc_cox_putcompparms(jpc_ms_t *, jpc_cstate_t *, jas_stream_t *, int, jpc_coxcp_t *)"
                 );
  }
  iVar1 = jpc_putuint8((jas_stream_t *)ms,val);
  if ((((iVar1 == 0) &&
       (iVar1 = jpc_putuint8((jas_stream_t *)ms,*(uint_fast8_t *)((long)&out->openmode_ + 2)),
       iVar1 == 0)) &&
      (iVar1 = jpc_putuint8((jas_stream_t *)ms,*(uint_fast8_t *)((long)&out->openmode_ + 3)),
      iVar1 == 0)) &&
     ((iVar1 = jpc_putuint8((jas_stream_t *)ms,(uint_fast8_t)out->bufmode_), iVar1 == 0 &&
      (iVar1 = jpc_putuint8((jas_stream_t *)ms,*(uint_fast8_t *)((long)&out->bufmode_ + 1)),
      iVar1 == 0)))) {
    iVar1 = 0;
    if (((int)cstate != 0) && (0 < out->flags_)) {
      lVar2 = 0;
      do {
        iVar1 = jpc_putuint8((jas_stream_t *)ms,
                             out->tinybuf_[lVar2 * 2 + -0x28] & 0xf |
                             out->tinybuf_[lVar2 * 2 + -0x27] << 4);
        if (iVar1 != 0) goto LAB_0011b6d4;
        lVar2 = lVar2 + 1;
        iVar1 = 0;
      } while (lVar2 < out->flags_);
    }
  }
  else {
LAB_0011b6d4:
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int jpc_cox_putcompparms(jpc_ms_t *ms, jpc_cstate_t *cstate,
  jas_stream_t *out, int prtflag, jpc_coxcp_t *compparms)
{
	int i;
	assert(compparms->numdlvls <= 32);

	/* Eliminate compiler warning about unused variables. */
	(void)ms;
	(void)cstate;

	if (jpc_putuint8(out, compparms->numdlvls) ||
	  jpc_putuint8(out, compparms->cblkwidthval) ||
	  jpc_putuint8(out, compparms->cblkheightval) ||
	  jpc_putuint8(out, compparms->cblksty) ||
	  jpc_putuint8(out, compparms->qmfbid)) {
		return -1;
	}
	if (prtflag) {
		for (i = 0; i < compparms->numrlvls; ++i) {
			if (jpc_putuint8(out,
			  ((compparms->rlvls[i].parheightval & 0xf) << 4) |
			  (compparms->rlvls[i].parwidthval & 0xf))) {
				return -1;
			}
		}
	}
	return 0;
}